

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

bool __thiscall
Js::JavascriptStackWalker::GetDisplayCaller(JavascriptStackWalker *this,JavascriptFunction **ppFunc)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    BVar3 = GetCaller(this,ppFunc,true);
    if (BVar3 == 0) break;
    if (ppFunc == (JavascriptFunction **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x356,"(ppFunc != nullptr)","ppFunc != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar2 = IsDisplayCaller(*ppFunc);
  } while (!bVar2);
  return SUB41(BVar3,0);
}

Assistant:

bool JavascriptStackWalker::GetDisplayCaller(_Out_opt_ JavascriptFunction ** ppFunc)
    {
        while (this->GetCaller(ppFunc))
        {
            Assert(ppFunc != nullptr);
            __analysis_assume(ppFunc != nullptr);
            if (IsDisplayCaller(*ppFunc))
            {
                return true;
            }
        }
        return false;
    }